

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O2

void __thiscall CPubKey::Unserialize<DataStream>(CPubKey *this,DataStream *s)

{
  byte bVar1;
  uint uVar2;
  uint64_t uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  Span<unsigned_char> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = ReadCompactSize<DataStream>(s,true);
  uVar2 = (uint)uVar3;
  if (uVar2 < 0x42) {
    local_30.m_size = (size_t)(uVar2 & 0x7f);
    local_30.m_data = this->vch;
    DataStream::operator>>(s,&local_30);
    if ((this->vch[0] & 0xfe) == 2) {
      uVar4 = 0x21;
    }
    else {
      bVar1 = this->vch[0] - 4;
      uVar4 = 0;
      if (bVar1 < 4) {
        uVar4 = *(uint *)(&DAT_006fd1b0 + (ulong)bVar1 * 4);
      }
    }
    if (uVar4 == uVar2) goto LAB_004a1eda;
  }
  else {
    DataStream::ignore(s,uVar3 & 0xffffffff);
  }
  this->vch[0] = 0xff;
LAB_004a1eda:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        const unsigned int len(::ReadCompactSize(s));
        if (len <= SIZE) {
            s >> Span{vch, len};
            if (len != size()) {
                Invalidate();
            }
        } else {
            // invalid pubkey, skip available data
            s.ignore(len);
            Invalidate();
        }
    }